

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_export.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,ExportStatement *stmt)

{
  ClientContext *context;
  size_type sVar1;
  pointer pcVar2;
  SchemaCatalogEntry *pSVar3;
  TableCatalogEntry *table;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar4;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var5;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var6;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var7;
  bool bVar8;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> _Var9;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var10;
  undefined1 auVar11 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  pointer pCVar13;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> _Var14;
  char cVar15;
  char cVar16;
  pointer pCVar17;
  CopyInfo *this_00;
  pointer pCVar18;
  long *plVar19;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar20;
  pointer pCVar21;
  NotNullConstraint *pNVar22;
  ColumnDefinition *pCVar23;
  ColumnList *pCVar24;
  string *__a;
  LogicalType *__b;
  pointer pBVar25;
  BaseTableRef *this_01;
  pointer pBVar26;
  SelectNode *this_02;
  pointer pSVar27;
  Binder *this_03;
  pointer pLVar28;
  StatementProperties *pSVar29;
  NotImplementedException *this_04;
  element_type *peVar30;
  ulong uVar31;
  long *plVar32;
  __node_base args;
  pointer pLVar33;
  long lVar34;
  BoundAtClause *pBVar35;
  ulong __val;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_05;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar36;
  ColumnListIterator CVar37;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  templated_unique_single_t info;
  type plan;
  templated_unique_single_t statement;
  templated_unique_single_t exported_tables;
  templated_unique_single_t export_node;
  shared_ptr<duckdb::Binder,_true> copy_binder;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
  child_operator;
  BoundStatement bound_statement;
  string catalog;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  export_nodes;
  catalog_entry_vector_t tables;
  child_list_t<LogicalType> select_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  not_null_columns;
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> entry;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table_name_index;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_4b0;
  _Head_base<0UL,_duckdb::BaseTableRef_*,_false> local_4a8;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *local_4a0;
  optional_ptr<duckdb::Binder,_true> local_498;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_490;
  BoundStatement *local_488;
  _Head_base<0UL,_duckdb::BoundExportData_*,_false> local_480;
  undefined1 local_478 [8];
  pointer pbStack_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_458;
  element_type *local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  pointer local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  pointer local_3f8;
  pointer pbStack_3f0;
  pointer local_3e8;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3b8;
  __node_base local_3b0;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  LogicalType local_388;
  element_type local_370;
  _Hash_node_base local_330 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_320 [24];
  undefined1 local_308 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8 [32];
  string local_2c8;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  local_2a8;
  element_type *local_288;
  element_type *peStack_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_278;
  __node_base local_268;
  pointer pCStack_260;
  optional_ptr<duckdb::BoundParameterMap,_true> local_258;
  __node_base_ptr local_248;
  undefined1 local_240 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_228;
  undefined **local_208;
  optional_ptr<duckdb::DummyBinding,_true> local_200;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_1f8;
  element_type *local_1f0;
  element_type *local_1e8;
  undefined1 local_1e0 [136];
  __node_base _Stack_158;
  pointer local_150;
  undefined1 local_148 [8];
  element_type *peStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [6];
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_d0 [2];
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> local_c0;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  float local_48;
  size_type local_40;
  _Hash_node_base _Stack_38;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.ptr = this;
  local_488 = __return_storage_ptr__;
  LogicalType::LogicalType((LogicalType *)local_148,BOOLEAN);
  __l._M_len = 1;
  __l._M_array = (iterator)local_148;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_478,__l,
             (allocator_type *)local_68);
  local_3a8._0_8_ =
       (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_3a8._8_8_ =
       (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_398._0_8_ =
       (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_478;
  (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pbStack_470;
  (local_488->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_468._M_allocated_capacity;
  local_478 = (undefined1  [8])0x0;
  pbStack_470 = (pointer)0x0;
  local_468._M_allocated_capacity = 0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_3a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_478);
  LogicalType::~LogicalType((LogicalType *)local_148);
  local_3a8._0_8_ = local_398;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Success","");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_3a8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148,__l_00,(allocator_type *)local_68);
  local_478 = (undefined1  [8])
              (local_488->names).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_470 = (local_488->names).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_468._M_allocated_capacity =
       (size_type)
       (local_488->names).
       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_488->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_148;
  (local_488->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_140;
  (local_488->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_138[0]._0_8_;
  local_148 = (undefined1  [8])0x0;
  peStack_140 = (element_type *)0x0;
  local_138[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_478);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
    operator_delete((void *)local_3a8._0_8_);
  }
  context = (local_498.ptr)->context;
  local_3a8._0_8_ = local_398;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,anon_var_dwarf_4f001a4 + 9);
  local_478 = (undefined1  [8])&local_468;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_478,"main","");
  local_4a0 = &stmt->info;
  pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_4a0);
  local_148 = (undefined1  [8])
              Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                        (context,(string *)local_3a8,(string *)local_478,&pCVar17->format,
                         THROW_EXCEPTION,(QueryErrorContext)0xffffffffffffffff);
  optional_ptr<duckdb::CopyFunctionCatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CopyFunctionCatalogEntry,_true> *)local_148);
  local_3c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148;
  if (local_478 != (undefined1  [8])&local_468) {
    operator_delete((void *)local_478);
  }
  if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
    operator_delete((void *)local_3a8._0_8_);
  }
  if (*(copy_to_plan_t *)(local_3c0->_M_local_buf + 0x168) == (copy_to_plan_t)0x0 &&
      *(copy_to_bind_t *)(local_3c0->_M_local_buf + 0x178) == (copy_to_bind_t)0x0) {
    this_04 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_3a8._0_8_ = local_398;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3a8,"COPY TO is not supported for FORMAT \"%s\"","");
    pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_4a0);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    pcVar2 = (pCVar17->format)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (pCVar17->format)._M_string_length);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_04,(string *)local_3a8,&local_88);
    __cxa_throw(this_04,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  sVar1 = (stmt->database)._M_string_length;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  if (sVar1 == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2c8,anon_var_dwarf_4f001a4 + 9);
  }
  else {
    pcVar2 = (stmt->database)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_2c8,pcVar2,pcVar2 + sVar1);
  }
  local_288 = (element_type *)0x0;
  peStack_280 = (element_type *)0x0;
  local_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Catalog::GetSchemas(&local_c0,(local_498.ptr)->context,&local_2c8);
  if (local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pBVar35 = (BoundAtClause *)
              local_c0.
              super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pSVar3 = (SchemaCatalogEntry *)(pBVar35->unit)._M_dataplus._M_p;
      local_3a8._8_8_ = (pointer)0x0;
      local_398._8_8_ =
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_invoke;
      local_398._0_8_ =
           ::std::
           _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_export.cpp:178:56)>
           ::_M_manager;
      local_3a8._0_8_ = (pointer)&local_288;
      (*(pSVar3->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                (pSVar3,(local_498.ptr)->context,1,local_3a8);
      if ((element_type *)local_398._0_8_ != (element_type *)0x0) {
        (*(code *)local_398._0_8_)(local_3a8,local_3a8,3);
      }
      pBVar35 = (BoundAtClause *)&(pBVar35->unit)._M_string_length;
    } while (pBVar35 !=
             (BoundAtClause *)
             local_c0.
             super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ReorderTableEntries((catalog_entry_vector_t *)&local_288);
  local_3b0._M_nxt = (_Hash_node_base *)FileSystem::GetFileSystem((local_498.ptr)->context);
  local_480._M_head_impl = (BoundExportData *)operator_new(0x28);
  ((local_480._M_head_impl)->super_ParseInfo).info_type = BOUND_EXPORT_DATA;
  ((local_480._M_head_impl)->super_ParseInfo)._vptr_ParseInfo =
       (_func_int **)&PTR__BoundExportData_024ac400;
  ((local_480._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_480._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_480._M_head_impl)->data).
  super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>.
  super__Vector_base<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._0_8_ = local_68 + 0x30;
  local_68._8_8_ = &DAT_00000001;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = (__node_base_ptr)0x0;
  local_48 = 1.0;
  local_40 = 0;
  _Stack_38._M_nxt = (_Hash_node_base *)0x0;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.ptr = (vector<duckdb::DummyBinding,_true> *)peStack_280;
  if (local_288 != peStack_280) {
    local_1e8 = (element_type *)(local_3c0->_M_local_buf + 0x3b0);
    local_3b8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3f8;
    local_200.ptr = (DummyBinding *)(local_1e0 + 0x80);
    local_208 = &PTR__CopyStatement_0247e3e8;
    peVar30 = local_288;
    do {
      table = (TableCatalogEntry *)peVar30->_vptr_ExtraTypeInfo;
      local_1f0 = peVar30;
      this_00 = (CopyInfo *)operator_new(0x110);
      CopyInfo::CopyInfo(this_00);
      local_4b0._M_head_impl = this_00;
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                (local_4a0);
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&pCVar17->format);
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->(local_4a0);
      pCVar18 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      if (pCVar17 != pCVar18) {
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::vector<duckdb::Value,true>>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pCVar18->options,&(pCVar17->options)._M_h);
      }
      __val = 0;
      do {
        if (__val == 0) {
          pLVar33 = (pointer)local_398;
          plVar32 = (long *)(local_3a8 + 8);
          local_3a8._0_8_ = pLVar33;
        }
        else {
          cVar16 = '\x01';
          if (9 < __val) {
            uVar31 = __val;
            cVar15 = '\x04';
            do {
              cVar16 = cVar15;
              if (uVar31 < 100) {
                cVar16 = cVar16 + -2;
                goto LAB_00dd5dde;
              }
              if (uVar31 < 1000) {
                cVar16 = cVar16 + -1;
                goto LAB_00dd5dde;
              }
              if (uVar31 < 10000) goto LAB_00dd5dde;
              bVar8 = 99999 < uVar31;
              uVar31 = uVar31 / 10000;
              cVar15 = cVar16 + '\x04';
            } while (bVar8);
            cVar16 = cVar16 + '\x01';
          }
LAB_00dd5dde:
          local_248 = (__node_base_ptr)(local_240 + 8);
          ::std::__cxx11::string::_M_construct((ulong)&local_248,cVar16);
          ::std::__detail::__to_chars_10_impl<unsigned_long>
                    ((char *)local_248,local_240._0_4_,__val);
          plVar19 = (long *)::std::__cxx11::string::replace
                                      ((ulong)&local_248,0,(char *)0x0,0x1e0f1d8);
          local_3a8._0_8_ = local_398;
          pLVar33 = (pointer)(plVar19 + 2);
          if ((pointer)*plVar19 == pLVar33) {
            local_398._0_8_ = *(undefined8 *)pLVar33;
            local_398._8_8_ = plVar19[3];
          }
          else {
            local_398._0_8_ = *(undefined8 *)pLVar33;
            local_3a8._0_8_ = (pointer)*plVar19;
          }
          plVar32 = plVar19 + 1;
          local_3a8._8_8_ = plVar19[1];
          *plVar19 = (long)pLVar33;
        }
        *plVar32 = 0;
        pLVar33->id_ = INVALID;
        if ((__val != 0) && (local_248 != (__node_base_ptr)(local_240 + 8))) {
          operator_delete(local_248);
        }
        CreateFileName((string *)local_478,(string *)local_3a8,table,(string *)local_1e8);
        pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->(local_4a0);
        local_148 = (undefined1  [8])local_138;
        pcVar2 = (pCVar17->file_path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,pcVar2,pcVar2 + (pCVar17->file_path)._M_string_length);
        FileSystem::JoinPath
                  ((string *)local_308,(FileSystem *)local_3b0._M_nxt,(string *)local_148,
                   (string *)local_478);
        pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_4b0);
        ::std::__cxx11::string::_M_assign((string *)&pCVar17->file_path);
        pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                  operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                              *)&local_4b0);
        local_3d8.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68;
        pVar36 = ::std::
                 _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                           ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)local_3d8.
                               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,&pCVar17->file_path,
                            &local_3d8);
        if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
          operator_delete((void *)local_308._0_8_);
        }
        if (local_148 != (undefined1  [8])local_138) {
          operator_delete((void *)local_148);
        }
        if (local_478 != (undefined1  [8])&local_468) {
          operator_delete((void *)local_478);
        }
        if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
          operator_delete((void *)local_3a8._0_8_);
        }
        __val = __val + ((byte)~pVar36.second & 1);
      } while (((undefined1  [16])pVar36 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      pCVar17->is_from = false;
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&pCVar17->catalog);
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&pCVar17->schema);
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)&local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&pCVar17->table);
      local_268._M_nxt = (_Hash_node_base *)0x0;
      pCStack_260 = (pointer)0x0;
      local_258.ptr = (BoundParameterMap *)0x0;
      local_228.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_228.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_228.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar20 = TableCatalogEntry::GetConstraints(table);
      puVar4 = (pvVar20->
               super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (this_05 = (pvVar20->
                     super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar4;
          this_05 = this_05 + 1) {
        pCVar21 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_05);
        if (pCVar21->type == NOT_NULL) {
          pCVar21 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_05);
          pNVar22 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar21);
          pCVar23 = TableCatalogEntry::GetColumn(table,(LogicalIndex)(pNVar22->index).index);
          ColumnDefinition::GetName_abi_cxx11_((string *)local_3a8,pCVar23);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228
                     ,(string *)local_3a8);
          if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
            operator_delete((void *)local_3a8._0_8_);
          }
        }
      }
      pCVar24 = TableCatalogEntry::GetColumns(table);
      CVar37 = ColumnList::Physical(pCVar24);
      pCVar24 = CVar37.list;
      if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        local_468._8_8_ =
             ((long)(pCVar24->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pCVar24->columns).
                    super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    .
                    super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        local_468._8_8_ =
             (long)(pCVar24->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pCVar24->physical_columns).
                   super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
      }
      pbStack_470 = (pointer)CONCAT71(pbStack_470._1_7_,CVar37.physical);
      local_468._M_allocated_capacity = 0;
      if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pLVar33 = (pointer)(((long)(pCVar24->columns).
                                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                   .
                                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pCVar24->columns).
                                   super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                   .
                                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x7b425ed097b425ed);
      }
      else {
        pLVar33 = (pointer)((long)(pCVar24->physical_columns).
                                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pCVar24->physical_columns).
                                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3);
      }
      if (((undefined1  [16])CVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        lVar34 = ((long)(pCVar24->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar24->columns).
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        .
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      }
      else {
        lVar34 = (long)(pCVar24->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pCVar24->physical_columns).
                       super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
      }
      local_478 = (undefined1  [8])pCVar24;
      if ((pLVar33 != (pointer)0x0) || (local_468._8_8_ != lVar34)) {
        do {
          pCVar23 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                              ((ColumnLogicalIteratorInternal *)local_478);
          __a = ColumnDefinition::Name_abi_cxx11_(pCVar23);
          __b = ColumnDefinition::Type(pCVar23);
          ::std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                      *)local_3a8,__a,__b);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
          ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                    ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                      *)&local_268,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                      *)local_3a8);
          LogicalType::~LogicalType(&local_388);
          if ((pointer)local_3a8._0_8_ != (pointer)local_398) {
            operator_delete((void *)local_3a8._0_8_);
          }
          local_468._M_allocated_capacity = local_468._M_allocated_capacity + 1;
        } while ((((pointer)local_468._M_allocated_capacity != pLVar33) ||
                 (local_468._8_8_ != lVar34)) || (local_478 != (undefined1  [8])pCVar24));
      }
      pvVar12 = local_3b8;
      local_478 = (undefined1  [8])&local_468;
      pbStack_470 = (pointer)0x0;
      local_468._M_allocated_capacity = local_468._M_allocated_capacity & 0xffffffffffffff00;
      local_458 = &local_448;
      local_450 = (element_type *)0x0;
      local_448._M_local_buf[0] = '\0';
      local_438 = &local_428;
      local_430 = (pointer)0x0;
      local_428._M_local_buf[0] = '\0';
      local_418 = &local_408;
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      *(pointer *)(local_3b8 + 0x10) = (pointer)0x0;
      *(pointer *)pvVar12 = (pointer)0x0;
      *(pointer *)(pvVar12 + 8) = (pointer)0x0;
      ::std::__cxx11::string::_M_assign((string *)&local_438);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_4b0);
      ::std::__cxx11::string::_M_assign((string *)local_478);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&local_458);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 &local_4b0);
      ::std::__cxx11::string::_M_assign((string *)&local_418);
      pvVar12 = local_3b8;
      local_1e0._0_8_ = local_1e0 + 0x10;
      if (local_478 == (undefined1  [8])&local_468) {
        local_1e0._24_8_ = local_468._8_8_;
      }
      else {
        local_1e0._0_8_ = local_478;
      }
      local_1e0._16_8_ = local_468._M_allocated_capacity;
      local_1e0._8_8_ = pbStack_470;
      pbStack_470 = (pointer)0x0;
      local_468._M_allocated_capacity = local_468._M_allocated_capacity & 0xffffffffffffff00;
      local_1e0._32_8_ = local_1e0 + 0x30;
      if (local_458 == &local_448) {
        local_1e0._56_8_ = local_448._8_8_;
      }
      else {
        local_1e0._32_8_ = local_458;
      }
      local_1e0._49_7_ = local_448._M_allocated_capacity._1_7_;
      local_1e0[0x30] = local_448._M_local_buf[0];
      local_1e0._40_8_ = local_450;
      local_450 = (element_type *)0x0;
      local_448._M_local_buf[0] = '\0';
      local_1e0._64_8_ = local_1e0 + 0x50;
      if (local_438 == &local_428) {
        local_1e0._88_8_ = local_428._8_8_;
      }
      else {
        local_1e0._64_8_ = local_438;
      }
      local_1e0._81_7_ = local_428._M_allocated_capacity._1_7_;
      local_1e0[0x50] = local_428._M_local_buf[0];
      local_1e0._72_8_ = local_430;
      local_430 = (pointer)0x0;
      local_428._M_local_buf[0] = '\0';
      local_1e0._96_8_ = local_1e0 + 0x70;
      if (local_418 == &local_408) {
        local_1e0._120_8_ = local_408._8_8_;
      }
      else {
        local_1e0._96_8_ = local_418;
      }
      local_1e0._113_7_ = local_408._M_allocated_capacity._1_7_;
      local_1e0[0x70] = local_408._M_local_buf[0];
      local_1e0._104_8_ = local_410;
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      local_1e0._128_8_ = local_3f8;
      _Stack_158._M_nxt = (_Hash_node_base *)pbStack_3f0;
      local_150 = local_3e8;
      *(pointer *)(local_3b8 + 0x10) = (pointer)0x0;
      *(pointer *)pvVar12 = (pointer)0x0;
      *(pointer *)(pvVar12 + 8) = (pointer)0x0;
      local_478 = (undefined1  [8])&local_468;
      local_458 = &local_448;
      local_438 = &local_428;
      local_418 = &local_408;
      ExportedTableInfo::ExportedTableInfo
                ((ExportedTableInfo *)local_3a8,table,(ExportedTableData *)local_1e0,&local_228);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_200.ptr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._96_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x70)) {
        operator_delete((void *)local_1e0._96_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._64_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x50)) {
        operator_delete((void *)local_1e0._64_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._32_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x30)) {
        operator_delete((void *)local_1e0._32_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e0 + 0x10)) {
        operator_delete((void *)local_1e0._0_8_);
      }
      pBVar25 = unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                ::operator->((unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
                              *)&local_480);
      ::std::vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>::
      push_back(&(pBVar25->data).
                 super_vector<duckdb::ExportedTableInfo,_std::allocator<duckdb::ExportedTableInfo>_>
                ,(value_type *)local_3a8);
      CopyStatement::CopyStatement((CopyStatement *)local_148);
      _Var14._M_head_impl = local_d0[0]._M_head_impl;
      local_d0[0]._M_head_impl = local_4b0._M_head_impl;
      local_4b0._M_head_impl = (CopyInfo *)0x0;
      if ((__uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
          _Var14._M_head_impl !=
          (__uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)0x0) {
        (*((_Var14._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      this_01 = (BaseTableRef *)operator_new(0xd0);
      BaseTableRef::BaseTableRef(this_01);
      local_4a8._M_head_impl = this_01;
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 local_d0);
      pBVar26 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_4a8);
      ::std::__cxx11::string::_M_assign((string *)&pBVar26->catalog_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 local_d0);
      pBVar26 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_4a8);
      ::std::__cxx11::string::_M_assign((string *)&pBVar26->schema_name);
      unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                 local_d0);
      pBVar26 = unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::
                operator->((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>
                            *)&local_4a8);
      ::std::__cxx11::string::_M_assign((string *)&pBVar26->table_name);
      this_02 = (SelectNode *)operator_new(0xf0);
      SelectNode::SelectNode(this_02);
      _Var9._M_head_impl = local_4a8._M_head_impl;
      local_4a8._M_head_impl = (BaseTableRef *)0x0;
      local_490._M_head_impl = this_02;
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_490);
      _Var5._M_head_impl =
           (pSVar27->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar27->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           &(_Var9._M_head_impl)->super_TableRef;
      if (_Var5._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var5._M_head_impl)->_vptr_TableRef + 8))();
      }
      pCVar13 = pCStack_260;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (args._M_nxt = local_268._M_nxt; (pointer)args._M_nxt != pCVar13;
          args._M_nxt = (_Hash_node_base *)&(((pointer)args._M_nxt)->name).field_2) {
        make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string&>
                  ((duckdb *)local_308,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args._M_nxt)
        ;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&local_3d8,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_308);
        if ((long *)local_308._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_308._0_8_ + 8))();
        }
      }
      pSVar27 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_490);
      local_308._0_8_ =
           (pSVar27->select_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_308._8_8_ =
           (pSVar27->select_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_308._16_8_ =
           (pSVar27->select_list).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pSVar27->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_3d8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pSVar27->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_3d8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pSVar27->select_list).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_3d8.
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3d8.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)local_308);
      _Var10._M_head_impl = local_490._M_head_impl;
      local_490._M_head_impl = (SelectNode *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_3d8);
      if (local_490._M_head_impl != (SelectNode *)0x0) {
        (*((local_490._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      if (local_4a8._M_head_impl != (BaseTableRef *)0x0) {
        (*((local_4a8._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      }
      pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::
                operator->((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>
                            *)local_d0);
      _Var6._M_head_impl =
           (pCVar17->select_statement).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pCVar17->select_statement).
      super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var10._M_head_impl)->super_QueryNode;
      if (_Var6._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var6._M_head_impl)->_vptr_QueryNode + 8))();
      }
      CreateBinder((Binder *)&local_3d8,(local_498.ptr)->context,local_498,REGULAR_BINDER);
      this_03 = shared_ptr<duckdb::Binder,_true>::operator->
                          ((shared_ptr<duckdb::Binder,_true> *)&local_3d8);
      Bind((BoundStatement *)local_308,this_03,(CopyStatement *)local_148,EXPORT_DATABASE);
      local_4a8._M_head_impl = (BaseTableRef *)local_308._0_8_;
      local_308._0_8_ = (long *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&local_2a8,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_4a8);
      if (local_4a8._M_head_impl != (BaseTableRef *)0x0) {
        (**(code **)((long)(((__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                              *)&((local_4a8._M_head_impl)->super_TableRef)._vptr_TableRef)->
                           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                           )._M_t + 8))();
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_2e8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                 (local_308 + 8));
      if ((long *)local_308._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_308._0_8_ + 8))();
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_3d8.
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_3d8.
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_148 = (undefined1  [8])local_208;
      if (local_d0[0]._M_head_impl != (CopyInfo *)0x0) {
        (*((local_d0[0]._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      local_d0[0]._M_head_impl = (CopyInfo *)0x0;
      SQLStatement::~SQLStatement((SQLStatement *)local_148);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_320);
      if (local_370.extension_info.
          super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
          .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>._M_head_impl !=
          (unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>)
          local_330) {
        operator_delete((void *)local_370.extension_info.
                                super_unique_ptr<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::ExtensionTypeInfo,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::ExtensionTypeInfo_*,_std::default_delete<duckdb::ExtensionTypeInfo>_>
                                .super__Head_base<0UL,_duckdb::ExtensionTypeInfo_*,_false>.
                                _M_head_impl);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.alias._M_dataplus._M_p != &local_370.alias.field_2) {
        operator_delete(local_370.alias._M_dataplus._M_p);
      }
      if (local_388.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr != &local_370
         ) {
        operator_delete(local_388.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
      }
      if ((pointer)local_3a8._8_8_ != (pointer)(local_398 + 8)) {
        operator_delete((void *)local_3a8._8_8_);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_3b8);
      if (local_418 != &local_408) {
        operator_delete(local_418);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438);
      }
      if (local_458 != &local_448) {
        operator_delete(local_458);
      }
      if (local_478 != (undefined1  [8])&local_468) {
        operator_delete((void *)local_478);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_228);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_268);
      if (local_4b0._M_head_impl != (CopyInfo *)0x0) {
        (*((local_4b0._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      peVar30 = (element_type *)&local_1f0->type;
    } while (peVar30 != (element_type *)local_1f8.ptr);
  }
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_2a8.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_2a8.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_2a8.
       super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UnionOperators((Binder *)local_3a8,
                 (vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  *)local_498.ptr);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector(&local_a8);
  pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_4a0);
  cVar16 = (*(code *)(local_3b0._M_nxt)->_M_nxt[0xd]._M_nxt)(local_3b0._M_nxt,&pCVar17->file_path,0)
  ;
  if (cVar16 == '\0') {
    pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                        (local_4a0);
    (*(code *)(local_3b0._M_nxt)->_M_nxt[0xe]._M_nxt)(local_3b0._M_nxt,&pCVar17->file_path,0);
  }
  pCVar17 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                      (local_4a0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar17->catalog);
  make_uniq<duckdb::LogicalExport,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>,duckdb::unique_ptr<duckdb::BoundExportData,std::default_delete<duckdb::BoundExportData>,true>>
            ((duckdb *)local_478,(CopyFunction *)(local_3c0->_M_local_buf + 0x120),local_4a0,
             (unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
              *)&local_480);
  if ((pointer)local_3a8._0_8_ != (pointer)0x0) {
    pLVar28 = unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>::
              operator->((unique_ptr<duckdb::LogicalExport,_std::default_delete<duckdb::LogicalExport>,_true>
                          *)local_478);
    ::std::
    vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                *)&(pLVar28->super_LogicalOperator).children,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)local_3a8);
  }
  auVar11 = local_478;
  local_478 = (undefined1  [8])0x0;
  _Var7.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (local_488->plan).
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
  (local_488->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)auVar11;
  if (_Var7.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    (**(code **)(*(long *)_Var7.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl
                + 8))();
  }
  pSVar29 = GetStatementProperties(local_498.ptr);
  pSVar29->allow_stream_result = false;
  pSVar29->return_type = NOTHING;
  if (local_478 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_478 + 8))();
  }
  if ((pointer)local_3a8._0_8_ != (pointer)0x0) {
    (**(code **)&(*(element_type **)local_3a8._0_8_)->type)();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::~vector(&local_2a8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  if (local_480._M_head_impl != (BoundExportData *)0x0) {
    (*((local_480._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  if ((BoundAtClause *)
      local_c0.
      super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (BoundAtClause *)0x0) {
    operator_delete(local_c0.
                    super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288 != (element_type *)0x0) {
    operator_delete(local_288);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p);
  }
  return local_488;
}

Assistant:

BoundStatement Binder::Bind(ExportStatement &stmt) {
	// COPY TO a file
	BoundStatement result;
	result.types = {LogicalType::BOOLEAN};
	result.names = {"Success"};

	// lookup the format in the catalog
	auto &copy_function =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, INVALID_CATALOG, DEFAULT_SCHEMA, stmt.info->format);
	if (!copy_function.function.copy_to_bind && !copy_function.function.plan) {
		throw NotImplementedException("COPY TO is not supported for FORMAT \"%s\"", stmt.info->format);
	}

	// gather a list of all the tables
	string catalog = stmt.database.empty() ? INVALID_CATALOG : stmt.database;
	catalog_entry_vector_t tables;
	auto schemas = Catalog::GetSchemas(context, catalog);
	for (auto &schema : schemas) {
		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				tables.push_back(entry.Cast<TableCatalogEntry>());
			}
		});
	}

	// reorder tables because of foreign key constraint
	ReorderTableEntries(tables);

	// now generate the COPY statements for each of the tables
	auto &fs = FileSystem::GetFileSystem(context);

	auto exported_tables = make_uniq<BoundExportData>();

	unordered_set<string> table_name_index;
	vector<unique_ptr<LogicalOperator>> export_nodes;
	for (auto &t : tables) {
		auto &table = t.get().Cast<TableCatalogEntry>();
		auto info = make_uniq<CopyInfo>();
		// we copy the options supplied to the EXPORT
		info->format = stmt.info->format;
		info->options = stmt.info->options;
		// set up the file name for the COPY TO

		idx_t id = 0;
		while (true) {
			string id_suffix = id == 0 ? string() : "_" + to_string(id);
			auto name = CreateFileName(id_suffix, table, copy_function.function.extension);
			auto directory = stmt.info->file_path;
			auto full_path = fs.JoinPath(directory, name);
			info->file_path = full_path;
			auto insert_result = table_name_index.insert(info->file_path);
			if (insert_result.second) {
				// this name was not yet taken: take it
				break;
			}
			id++;
		}
		info->is_from = false;
		info->catalog = catalog;
		info->schema = table.schema.name;
		info->table = table.name;

		// We can not export generated columns
		child_list_t<LogicalType> select_list;
		// Let's verify if any on these columns have not null constraints
		vector<string> not_null_columns;
		for (auto &constaint : table.GetConstraints()) {
			if (constaint->type == ConstraintType::NOT_NULL) {
				auto &not_null_constraint = constaint->Cast<NotNullConstraint>();
				not_null_columns.push_back(table.GetColumn(not_null_constraint.index).GetName());
			}
		}
		for (auto &col : table.GetColumns().Physical()) {
			select_list.push_back(std::make_pair(col.Name(), col.Type()));
		}

		ExportedTableData exported_data;
		exported_data.database_name = catalog;
		exported_data.table_name = info->table;
		exported_data.schema_name = info->schema;

		exported_data.file_path = info->file_path;

		ExportedTableInfo table_info(table, std::move(exported_data), not_null_columns);
		exported_tables->data.push_back(table_info);
		id++;

		// generate the copy statement and bind it
		CopyStatement copy_stmt;
		copy_stmt.info = std::move(info);
		copy_stmt.info->select_statement = CreateSelectStatement(copy_stmt, select_list);

		auto copy_binder = Binder::CreateBinder(context, this);
		auto bound_statement = copy_binder->Bind(copy_stmt, CopyToType::EXPORT_DATABASE);

		auto plan = std::move(bound_statement.plan);

		export_nodes.push_back(std::move(plan));
	}
	auto child_operator = UnionOperators(std::move(export_nodes));

	// try to create the directory, if it doesn't exist yet
	// a bit hacky to do it here, but we need to create the directory BEFORE the copy statements run
	if (!fs.DirectoryExists(stmt.info->file_path)) {
		fs.CreateDirectory(stmt.info->file_path);
	}

	stmt.info->catalog = catalog;
	// create the export node
	auto export_node =
	    make_uniq<LogicalExport>(copy_function.function, std::move(stmt.info), std::move(exported_tables));

	if (child_operator) {
		export_node->children.push_back(std::move(child_operator));
	}

	result.plan = std::move(export_node);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::NOTHING;
	return result;
}